

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O2

char * uloc_toLegacyKey_63(char *keyword)

{
  UBool UVar1;
  char *pcVar2;
  char *p;
  char *pcVar3;
  
  pcVar2 = ulocimp_toLegacyKey_63(keyword);
  if (pcVar2 == (char *)0x0) {
    for (pcVar3 = keyword;
        (pcVar2 = keyword, *pcVar3 != '\0' &&
        ((UVar1 = uprv_isASCIILetter_63(*pcVar3), UVar1 != '\0' ||
         (pcVar2 = (char *)0x0, (byte)(*pcVar3 - 0x30U) < 10)))); pcVar3 = pcVar3 + 1) {
    }
  }
  return pcVar2;
}

Assistant:

U_CAPI const char* U_EXPORT2
uloc_toLegacyKey(const char* keyword)
{
    const char* legacyKey = ulocimp_toLegacyKey(keyword);
    if (legacyKey == NULL) {
        // Checks if the specified locale key is well-formed with the legacy locale syntax.
        //
        // Note:
        //  LDML/CLDR provides some definition of keyword syntax in
        //  * http://www.unicode.org/reports/tr35/#Unicode_locale_identifier and
        //  * http://www.unicode.org/reports/tr35/#Old_Locale_Extension_Syntax
        //  Keys can only consist of [0-9a-zA-Z].
        if (isWellFormedLegacyKey(keyword)) {
            return keyword;
        }
    }
    return legacyKey;
}